

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O3

Output * __thiscall senjo::Output::operator<<(Output *this,char **x)

{
  char *__s;
  size_t sVar1;
  
  __s = *x;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1b7198);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  return this;
}

Assistant:

Output& operator<<(const T& x) {
    std::cout << x;
    return *this;
  }